

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Operator.cpp
# Opt level: O0

Type * slang::ast::OpInfo::binaryType
                 (Compilation *compilation,Type *lt,Type *rt,bool forceFourState,
                 bool signednessFromRt)

{
  bool bVar1;
  bitmask<slang::ast::IntegralFlags> bVar2;
  bitwidth_t bVar3;
  uint *puVar4;
  byte in_CL;
  Type *in_RDX;
  Type *in_RSI;
  Compilation *in_RDI;
  byte in_R8B;
  Type *in_stack_00000008;
  bitmask<slang::ast::IntegralFlags> flags;
  bitmask<slang::ast::IntegralFlags> rf;
  bitmask<slang::ast::IntegralFlags> lf;
  bitwidth_t width;
  Type *result;
  Type *in_stack_00000060;
  Type *in_stack_00000068;
  bitwidth_t in_stack_00000074;
  Compilation *in_stack_00000078;
  bitmask<slang::ast::IntegralFlags> in_stack_00000087;
  bool local_53;
  bool local_52;
  byte local_51;
  undefined1 in_stack_ffffffffffffffb0;
  undefined1 in_stack_ffffffffffffffb1;
  undefined2 in_stack_ffffffffffffffb2;
  undefined1 in_stack_ffffffffffffffb4;
  bitmask<slang::ast::IntegralFlags> in_stack_ffffffffffffffb5;
  undefined1 in_stack_ffffffffffffffb6;
  bitmask<slang::ast::IntegralFlags> in_stack_ffffffffffffffb7;
  bitmask<slang::ast::IntegralFlags> in_stack_ffffffffffffffb8;
  bitmask<slang::ast::IntegralFlags> in_stack_ffffffffffffffb9;
  bitmask<slang::ast::IntegralFlags> in_stack_ffffffffffffffba;
  bitmask<slang::ast::IntegralFlags> in_stack_ffffffffffffffbb;
  undefined2 in_stack_ffffffffffffffbc;
  bitmask<slang::ast::IntegralFlags> in_stack_ffffffffffffffbe;
  bitmask<slang::ast::IntegralFlags> in_stack_ffffffffffffffbf;
  bitmask<slang::ast::IntegralFlags> local_3f;
  underlying_type local_3e;
  underlying_type local_3d;
  bitmask<slang::ast::IntegralFlags> flags_00;
  bitwidth_t local_38;
  uint local_34;
  Type *local_30;
  byte local_22;
  byte local_21;
  Type *local_20;
  Type *local_18;
  Compilation *local_10;
  Type *local_8;
  
  local_21 = in_CL & 1;
  local_22 = in_R8B & 1;
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  bVar1 = Type::isNumeric((Type *)CONCAT17(in_stack_ffffffffffffffb7.m_bits,
                                           CONCAT16(in_stack_ffffffffffffffb6,
                                                    CONCAT15(in_stack_ffffffffffffffb5.m_bits,
                                                             CONCAT14(in_stack_ffffffffffffffb4,
                                                                      CONCAT22(
                                                  in_stack_ffffffffffffffb2,
                                                  CONCAT11(in_stack_ffffffffffffffb1,
                                                           in_stack_ffffffffffffffb0)))))));
  if ((bVar1) &&
     (bVar1 = Type::isNumeric((Type *)CONCAT17(in_stack_ffffffffffffffb7.m_bits,
                                               CONCAT16(in_stack_ffffffffffffffb6,
                                                        CONCAT15(in_stack_ffffffffffffffb5.m_bits,
                                                                 CONCAT14(in_stack_ffffffffffffffb4,
                                                                          CONCAT22(
                                                  in_stack_ffffffffffffffb2,
                                                  CONCAT11(in_stack_ffffffffffffffb1,
                                                           in_stack_ffffffffffffffb0))))))), bVar1))
  {
    bVar1 = Type::isMatching(in_stack_00000068,in_stack_00000060);
    if ((bVar1) &&
       ((((local_21 & 1) == 0 || (bVar1 = Type::isFourState(in_stack_00000008), bVar1)) ||
        (bVar1 = Type::isEnum((Type *)0xbc09b9), bVar1)))) {
      local_8 = local_18;
    }
    else {
      bVar1 = Type::isFloating((Type *)0xbc09da);
      if ((bVar1) || (bVar1 = Type::isFloating((Type *)0xbc09e8), bVar1)) {
        bVar1 = Type::isFloating((Type *)0xbc09f8);
        if (((bVar1) &&
            (bVar3 = Type::getBitWidth((Type *)CONCAT17(in_stack_ffffffffffffffbf.m_bits,
                                                        CONCAT16(in_stack_ffffffffffffffbe.m_bits,
                                                                 CONCAT24(in_stack_ffffffffffffffbc,
                                                                          CONCAT13(
                                                  in_stack_ffffffffffffffbb.m_bits,
                                                  CONCAT12(in_stack_ffffffffffffffba.m_bits,
                                                           CONCAT11(in_stack_ffffffffffffffb9.m_bits
                                                                    ,in_stack_ffffffffffffffb8.
                                                                     m_bits))))))), bVar3 == 0x40))
           || ((bVar1 = Type::isFloating((Type *)0xbc0a17), bVar1 &&
               (bVar3 = Type::getBitWidth((Type *)CONCAT17(in_stack_ffffffffffffffbf.m_bits,
                                                           CONCAT16(in_stack_ffffffffffffffbe.m_bits
                                                                    ,CONCAT24(
                                                  in_stack_ffffffffffffffbc,
                                                  CONCAT13(in_stack_ffffffffffffffbb.m_bits,
                                                           CONCAT12(in_stack_ffffffffffffffba.m_bits
                                                                    ,CONCAT11(
                                                  in_stack_ffffffffffffffb9.m_bits,
                                                  in_stack_ffffffffffffffb8.m_bits))))))),
               bVar3 == 0x40)))) {
          local_30 = Compilation::getRealType(local_10);
        }
        else {
          local_30 = Compilation::getShortRealType(local_10);
        }
      }
      else {
        local_38 = Type::getBitWidth((Type *)CONCAT17(in_stack_ffffffffffffffbf.m_bits,
                                                      CONCAT16(in_stack_ffffffffffffffbe.m_bits,
                                                               CONCAT24(in_stack_ffffffffffffffbc,
                                                                        CONCAT13(
                                                  in_stack_ffffffffffffffbb.m_bits,
                                                  CONCAT12(in_stack_ffffffffffffffba.m_bits,
                                                           CONCAT11(in_stack_ffffffffffffffb9.m_bits
                                                                    ,in_stack_ffffffffffffffb8.
                                                                     m_bits)))))));
        bVar3 = Type::getBitWidth((Type *)CONCAT17(in_stack_ffffffffffffffbf.m_bits,
                                                   CONCAT16(in_stack_ffffffffffffffbe.m_bits,
                                                            CONCAT24(in_stack_ffffffffffffffbc,
                                                                     CONCAT13(
                                                  in_stack_ffffffffffffffbb.m_bits,
                                                  CONCAT12(in_stack_ffffffffffffffba.m_bits,
                                                           CONCAT11(in_stack_ffffffffffffffb9.m_bits
                                                                    ,in_stack_ffffffffffffffb8.
                                                                     m_bits)))))));
        flags_00.m_bits = (underlying_type)(bVar3 >> 0x18);
        puVar4 = std::max<unsigned_int>(&local_38,(uint *)&stack0xffffffffffffffc4);
        local_34 = *puVar4;
        local_3d = (underlying_type)
                   Type::getIntegralFlags
                             ((Type *)CONCAT17(in_stack_ffffffffffffffbf.m_bits,
                                               CONCAT16(in_stack_ffffffffffffffbe.m_bits,
                                                        CONCAT24(in_stack_ffffffffffffffbc,
                                                                 CONCAT13(in_stack_ffffffffffffffbb.
                                                                          m_bits,CONCAT12(
                                                  in_stack_ffffffffffffffba.m_bits,
                                                  CONCAT11(in_stack_ffffffffffffffb9.m_bits,
                                                           in_stack_ffffffffffffffb8.m_bits)))))));
        local_3e = (underlying_type)
                   Type::getIntegralFlags
                             ((Type *)CONCAT17(in_stack_ffffffffffffffbf.m_bits,
                                               CONCAT16(in_stack_ffffffffffffffbe.m_bits,
                                                        CONCAT24(in_stack_ffffffffffffffbc,
                                                                 CONCAT13(in_stack_ffffffffffffffbb.
                                                                          m_bits,CONCAT12(
                                                  in_stack_ffffffffffffffba.m_bits,
                                                  CONCAT11(in_stack_ffffffffffffffb9.m_bits,
                                                           in_stack_ffffffffffffffb8.m_bits)))))));
        bitmask<slang::ast::IntegralFlags>::bitmask(&local_3f);
        bitmask<slang::ast::IntegralFlags>::bitmask
                  ((bitmask<slang::ast::IntegralFlags> *)&stack0xffffffffffffffbf,Signed);
        bitmask<slang::ast::IntegralFlags>::operator&
                  ((bitmask<slang::ast::IntegralFlags> *)
                   CONCAT17(in_stack_ffffffffffffffbf.m_bits,
                            CONCAT16(in_stack_ffffffffffffffbe.m_bits,
                                     CONCAT24(in_stack_ffffffffffffffbc,
                                              CONCAT13(in_stack_ffffffffffffffbb.m_bits,
                                                       CONCAT12(in_stack_ffffffffffffffba.m_bits,
                                                                CONCAT11(in_stack_ffffffffffffffb9.
                                                                         m_bits,
                                                  in_stack_ffffffffffffffb8.m_bits)))))),
                   (bitmask<slang::ast::IntegralFlags> *)
                   CONCAT17(in_stack_ffffffffffffffb7.m_bits,
                            CONCAT16(in_stack_ffffffffffffffb6,
                                     CONCAT15(in_stack_ffffffffffffffb5.m_bits,
                                              CONCAT14(in_stack_ffffffffffffffb4,
                                                       CONCAT22(in_stack_ffffffffffffffb2,
                                                                CONCAT11(in_stack_ffffffffffffffb1,
                                                                         in_stack_ffffffffffffffb0))
                                                      )))));
        bVar1 = slang::bitmask::operator_cast_to_bool
                          ((bitmask<slang::ast::IntegralFlags> *)0xbc0ad4);
        if (bVar1) {
          bitmask<slang::ast::IntegralFlags>::bitmask
                    ((bitmask<slang::ast::IntegralFlags> *)&stack0xffffffffffffffbd,Signed);
          in_stack_ffffffffffffffbe =
               bitmask<slang::ast::IntegralFlags>::operator&
                         ((bitmask<slang::ast::IntegralFlags> *)
                          CONCAT17(in_stack_ffffffffffffffbf.m_bits,
                                   CONCAT16(in_stack_ffffffffffffffbe.m_bits,
                                            CONCAT24(in_stack_ffffffffffffffbc,
                                                     CONCAT13(in_stack_ffffffffffffffbb.m_bits,
                                                              CONCAT12(in_stack_ffffffffffffffba.
                                                                       m_bits,CONCAT11(
                                                  in_stack_ffffffffffffffb9.m_bits,
                                                  in_stack_ffffffffffffffb8.m_bits)))))),
                          (bitmask<slang::ast::IntegralFlags> *)
                          CONCAT17(in_stack_ffffffffffffffb7.m_bits,
                                   CONCAT16(in_stack_ffffffffffffffb6,
                                            CONCAT15(in_stack_ffffffffffffffb5.m_bits,
                                                     CONCAT14(in_stack_ffffffffffffffb4,
                                                              CONCAT22(in_stack_ffffffffffffffb2,
                                                                       CONCAT11(
                                                  in_stack_ffffffffffffffb1,
                                                  in_stack_ffffffffffffffb0)))))));
          bVar1 = slang::bitmask::operator_cast_to_bool
                            ((bitmask<slang::ast::IntegralFlags> *)0xbc0b06);
          local_51 = 1;
          if (!bVar1) {
            local_51 = local_22;
          }
          if ((local_51 & 1) != 0) {
            bitmask<slang::ast::IntegralFlags>::bitmask
                      ((bitmask<slang::ast::IntegralFlags> *)&stack0xffffffffffffffbc,Signed);
            bitmask<slang::ast::IntegralFlags>::operator|=
                      (&local_3f,(bitmask<slang::ast::IntegralFlags> *)&stack0xffffffffffffffbc);
          }
        }
        local_52 = true;
        if ((local_21 & 1) == 0) {
          bitmask<slang::ast::IntegralFlags>::bitmask
                    ((bitmask<slang::ast::IntegralFlags> *)&stack0xffffffffffffffba,FourState);
          in_stack_ffffffffffffffbb =
               bitmask<slang::ast::IntegralFlags>::operator&
                         ((bitmask<slang::ast::IntegralFlags> *)
                          CONCAT17(in_stack_ffffffffffffffbf.m_bits,
                                   CONCAT16(in_stack_ffffffffffffffbe.m_bits,
                                            CONCAT24(in_stack_ffffffffffffffbc,
                                                     CONCAT13(in_stack_ffffffffffffffbb.m_bits,
                                                              CONCAT12(in_stack_ffffffffffffffba.
                                                                       m_bits,CONCAT11(
                                                  in_stack_ffffffffffffffb9.m_bits,
                                                  in_stack_ffffffffffffffb8.m_bits)))))),
                          (bitmask<slang::ast::IntegralFlags> *)
                          CONCAT17(in_stack_ffffffffffffffb7.m_bits,
                                   CONCAT16(in_stack_ffffffffffffffb6,
                                            CONCAT15(in_stack_ffffffffffffffb5.m_bits,
                                                     CONCAT14(in_stack_ffffffffffffffb4,
                                                              CONCAT22(in_stack_ffffffffffffffb2,
                                                                       CONCAT11(
                                                  in_stack_ffffffffffffffb1,
                                                  in_stack_ffffffffffffffb0)))))));
          bVar1 = slang::bitmask::operator_cast_to_bool
                            ((bitmask<slang::ast::IntegralFlags> *)0xbc0b7e);
          local_52 = true;
          if (!bVar1) {
            bitmask<slang::ast::IntegralFlags>::bitmask
                      ((bitmask<slang::ast::IntegralFlags> *)&stack0xffffffffffffffb8,FourState);
            in_stack_ffffffffffffffb9 =
                 bitmask<slang::ast::IntegralFlags>::operator&
                           ((bitmask<slang::ast::IntegralFlags> *)
                            CONCAT17(in_stack_ffffffffffffffbf.m_bits,
                                     CONCAT16(in_stack_ffffffffffffffbe.m_bits,
                                              CONCAT24(in_stack_ffffffffffffffbc,
                                                       CONCAT13(in_stack_ffffffffffffffbb.m_bits,
                                                                CONCAT12(in_stack_ffffffffffffffba.
                                                                         m_bits,CONCAT11(
                                                  in_stack_ffffffffffffffb9.m_bits,
                                                  in_stack_ffffffffffffffb8.m_bits)))))),
                            (bitmask<slang::ast::IntegralFlags> *)
                            CONCAT17(in_stack_ffffffffffffffb7.m_bits,
                                     CONCAT16(in_stack_ffffffffffffffb6,
                                              CONCAT15(in_stack_ffffffffffffffb5.m_bits,
                                                       CONCAT14(in_stack_ffffffffffffffb4,
                                                                CONCAT22(in_stack_ffffffffffffffb2,
                                                                         CONCAT11(
                                                  in_stack_ffffffffffffffb1,
                                                  in_stack_ffffffffffffffb0)))))));
            local_52 = slang::bitmask::operator_cast_to_bool
                                 ((bitmask<slang::ast::IntegralFlags> *)0xbc0bb7);
          }
        }
        if (local_52 != false) {
          bitmask<slang::ast::IntegralFlags>::bitmask
                    ((bitmask<slang::ast::IntegralFlags> *)&stack0xffffffffffffffb7,FourState);
          bitmask<slang::ast::IntegralFlags>::operator|=
                    (&local_3f,(bitmask<slang::ast::IntegralFlags> *)&stack0xffffffffffffffb7);
        }
        bitmask<slang::ast::IntegralFlags>::bitmask
                  ((bitmask<slang::ast::IntegralFlags> *)&stack0xffffffffffffffb5,Reg);
        bVar2 = bitmask<slang::ast::IntegralFlags>::operator&
                          ((bitmask<slang::ast::IntegralFlags> *)
                           CONCAT17(in_stack_ffffffffffffffbf.m_bits,
                                    CONCAT16(in_stack_ffffffffffffffbe.m_bits,
                                             CONCAT24(in_stack_ffffffffffffffbc,
                                                      CONCAT13(in_stack_ffffffffffffffbb.m_bits,
                                                               CONCAT12(in_stack_ffffffffffffffba.
                                                                        m_bits,CONCAT11(
                                                  in_stack_ffffffffffffffb9.m_bits,
                                                  in_stack_ffffffffffffffb8.m_bits)))))),
                           (bitmask<slang::ast::IntegralFlags> *)
                           CONCAT17(in_stack_ffffffffffffffb7.m_bits,
                                    CONCAT16(in_stack_ffffffffffffffb6,
                                             CONCAT15(in_stack_ffffffffffffffb5.m_bits,
                                                      CONCAT14(in_stack_ffffffffffffffb4,
                                                               CONCAT22(in_stack_ffffffffffffffb2,
                                                                        CONCAT11(
                                                  in_stack_ffffffffffffffb1,
                                                  in_stack_ffffffffffffffb0)))))));
        bVar1 = slang::bitmask::operator_cast_to_bool
                          ((bitmask<slang::ast::IntegralFlags> *)0xbc0c0f);
        local_53 = false;
        if (bVar1) {
          bitmask<slang::ast::IntegralFlags>::bitmask
                    ((bitmask<slang::ast::IntegralFlags> *)&stack0xffffffffffffffb3,Reg);
          bitmask<slang::ast::IntegralFlags>::operator&
                    ((bitmask<slang::ast::IntegralFlags> *)
                     CONCAT17(in_stack_ffffffffffffffbf.m_bits,
                              CONCAT16(in_stack_ffffffffffffffbe.m_bits,
                                       CONCAT24(in_stack_ffffffffffffffbc,
                                                CONCAT13(in_stack_ffffffffffffffbb.m_bits,
                                                         CONCAT12(in_stack_ffffffffffffffba.m_bits,
                                                                  CONCAT11(in_stack_ffffffffffffffb9
                                                                           .m_bits,
                                                  in_stack_ffffffffffffffb8.m_bits)))))),
                     (bitmask<slang::ast::IntegralFlags> *)
                     CONCAT17(in_stack_ffffffffffffffb7.m_bits,
                              CONCAT16(bVar2.m_bits,
                                       CONCAT15(in_stack_ffffffffffffffb5.m_bits,
                                                CONCAT14(in_stack_ffffffffffffffb4,
                                                         CONCAT22(in_stack_ffffffffffffffb2,
                                                                  CONCAT11(in_stack_ffffffffffffffb1
                                                                           ,
                                                  in_stack_ffffffffffffffb0)))))));
          local_53 = slang::bitmask::operator_cast_to_bool
                               ((bitmask<slang::ast::IntegralFlags> *)0xbc0c4a);
        }
        if (local_53 != false) {
          bitmask<slang::ast::IntegralFlags>::bitmask
                    ((bitmask<slang::ast::IntegralFlags> *)&stack0xffffffffffffffb2,Reg);
          bitmask<slang::ast::IntegralFlags>::operator|=
                    (&local_3f,(bitmask<slang::ast::IntegralFlags> *)&stack0xffffffffffffffb2);
        }
        if ((local_34 == 1) &&
           ((bVar1 = Type::isScalar((Type *)0xbc0c87), bVar1 ||
            (bVar1 = Type::isScalar((Type *)0xbc0c95), bVar1)))) {
          local_30 = Compilation::getScalarType
                               ((Compilation *)
                                CONCAT17(in_stack_ffffffffffffffbf.m_bits,
                                         CONCAT16(in_stack_ffffffffffffffbe.m_bits,
                                                  CONCAT24(in_stack_ffffffffffffffbc,
                                                           CONCAT13(in_stack_ffffffffffffffbb.m_bits
                                                                    ,CONCAT12(
                                                  in_stack_ffffffffffffffba.m_bits,
                                                  CONCAT11(in_stack_ffffffffffffffb9.m_bits,
                                                           in_stack_ffffffffffffffb8.m_bits)))))),
                                flags_00);
        }
        else {
          local_30 = Compilation::getType(in_stack_00000078,in_stack_00000074,in_stack_00000087);
        }
      }
      bVar1 = Type::isMatching(in_stack_00000068,in_stack_00000060);
      if (bVar1) {
        local_8 = local_18;
      }
      else {
        bVar1 = Type::isMatching(in_stack_00000068,in_stack_00000060);
        if (bVar1) {
          local_8 = local_20;
        }
        else {
          local_8 = local_30;
        }
      }
    }
  }
  else {
    local_8 = Compilation::getErrorType(local_10);
  }
  return local_8;
}

Assistant:

const Type* OpInfo::binaryType(Compilation& compilation, const Type* lt, const Type* rt,
                               bool forceFourState, bool signednessFromRt) {
    if (!lt->isNumeric() || !rt->isNumeric())
        return &compilation.getErrorType();

    // If both sides are the same type just use that type.
    // NOTE: This specifically ignores the forceFourState option for enums,
    // as that better matches expectations. This area of the LRM is underspecified.
    if (lt->isMatching(*rt)) {
        if (!forceFourState || lt->isFourState() || lt->isEnum())
            return lt;
    }

    // Figure out what the result type of an arithmetic binary operator should be. The rules are:
    // - If either operand is real, the result is real
    // - Otherwise, if either operand is shortreal, the result is shortreal
    // - Otherwise, result is integral with the following properties:
    //      - Bit width is max(lhs, rhs)
    //      - If either operand is four state (or if we force it), the result is four state
    //      - If either operand is unsigned, the result is unsigned
    const Type* result;
    if (lt->isFloating() || rt->isFloating()) {
        if ((lt->isFloating() && lt->getBitWidth() == 64) ||
            (rt->isFloating() && rt->getBitWidth() == 64)) {
            result = &compilation.getRealType();
        }
        else {
            result = &compilation.getShortRealType();
        }
    }
    else {
        bitwidth_t width = std::max(lt->getBitWidth(), rt->getBitWidth());

        bitmask<IntegralFlags> lf = lt->getIntegralFlags();
        bitmask<IntegralFlags> rf = rt->getIntegralFlags();

        bitmask<IntegralFlags> flags;
        if (rf & IntegralFlags::Signed) {
            if ((lf & IntegralFlags::Signed) || signednessFromRt)
                flags |= IntegralFlags::Signed;
        }

        if (forceFourState || (lf & IntegralFlags::FourState) || (rf & IntegralFlags::FourState))
            flags |= IntegralFlags::FourState;
        if ((lf & IntegralFlags::Reg) && (rf & IntegralFlags::Reg))
            flags |= IntegralFlags::Reg;

        // If the width is 1, try to preserve whether this was a packed array with a width of 1
        // or a plain scalar type with no dimensions specified.
        if (width == 1 && (lt->isScalar() || rt->isScalar()))
            result = &compilation.getScalarType(flags);
        else
            result = &compilation.getType(width, flags);
    }

    // Attempt to preserve any type aliases passed in when selecting the result.
    if (lt->isMatching(*result))
        return lt;
    if (rt->isMatching(*result))
        return rt;

    return result;
}